

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsStatus __thiscall HEkk::solve(HEkk *this,bool force_phase2)

{
  HighsSimplexAnalysis *this_00;
  HighsSimplexInfo *info;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  HighsOptions *pHVar6;
  undefined1 *puVar7;
  HighsDebugStatus HVar8;
  HighsStatus HVar9;
  HighsStatus HVar10;
  char *format;
  HEkk *this_01;
  HighsLogOptions *log_options_;
  string algorithm_name;
  HEkkPrimal primal_solver_1;
  HEkkPrimal primal_solver;
  undefined1 *local_32d8;
  char *local_32d0;
  undefined1 local_32c8 [16];
  string local_32b8;
  undefined1 local_3298 [32];
  HighsLogOptions local_3278;
  HighsLogOptions local_3218;
  HighsLogOptions local_31b8;
  HEkkPrimal local_3158;
  undefined1 local_2b08 [10968];
  
  debugInitialise(this);
  initialiseAnalysis(this);
  initialiseControl(this);
  this_00 = &this->analysis_;
  if ((this->analysis_).analyse_simplex_time == true) {
    HighsSimplexAnalysis::simplexTimerStart(this_00,0,0);
  }
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;
  this->previous_iteration_cycling_detected = -0x7fffffff;
  initialiseForSolve(this);
  local_3298._0_8_ = (HEkk *)(local_3298 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3298,"Before HEkk::solve()","");
  HVar8 = HSimplexNla::debugCheckData(&this->simplex_nla_,(string *)local_3298);
  this_01 = (HEkk *)local_3298._0_8_;
  if ((HEkk *)local_3298._0_8_ != (HEkk *)(local_3298 + 0x10)) {
    operator_delete((void *)local_3298._0_8_);
  }
  if (HVar8 != kOk) {
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                 "Error in simplex NLA data\n");
    HVar9 = kError;
    HVar10 = kError;
LAB_00341d6d:
    returnFromEkkSolve(this,HVar10);
    return HVar9;
  }
  if (this->model_status_ == kOptimal) {
    HVar9 = kOk;
    HVar10 = kOk;
    goto LAB_00341d6d;
  }
  local_32d8 = local_32c8;
  local_32d0 = (char *)0x0;
  local_32c8[0] = 0;
  (this->dual_ray_record_).index = -1;
  (this->dual_ray_record_).sign = 0;
  pdVar5 = (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar5) {
    (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar5;
  }
  (this->primal_ray_record_).index = -1;
  (this->primal_ray_record_).sign = 0;
  pdVar5 = (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar5) {
    (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar5;
  }
  info = &this->info_;
  (this->info_).allow_cost_shifting = true;
  (this->info_).allow_cost_perturbation = true;
  (this->info_).allow_bound_perturbation = true;
  chooseSimplexStrategyThreads(this_01,this->options_,info);
  if ((this->info_).simplex_strategy == 4) {
    std::__cxx11::string::_M_replace((ulong)&local_32d8,0,local_32d0,0x3d92df);
    reportSimplexPhaseIterations
              (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
               true);
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                 "Using EKK primal simplex solver\n");
    HEkkPrimal::HEkkPrimal((HEkkPrimal *)local_2b08,this);
    HVar9 = HEkkPrimal::solve((HEkkPrimal *)local_2b08,force_phase2);
    pHVar6 = this->options_;
    local_31b8.log_stream = (pHVar6->super_HighsOptionsStruct).log_options.log_stream;
    local_31b8.output_flag = (pHVar6->super_HighsOptionsStruct).log_options.output_flag;
    local_31b8.log_to_console = (pHVar6->super_HighsOptionsStruct).log_options.log_to_console;
    local_31b8.log_dev_level = (pHVar6->super_HighsOptionsStruct).log_options.log_dev_level;
    local_31b8.user_log_callback = (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback;
    local_31b8.user_log_callback_data =
         (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback_data;
    pfVar1 = &local_31b8.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,&(pHVar6->super_HighsOptionsStruct).log_options.user_callback);
    local_31b8.user_callback_active =
         (pHVar6->super_HighsOptionsStruct).log_options.user_callback_active;
    local_31b8.user_callback_data =
         (pHVar6->super_HighsOptionsStruct).log_options.user_callback_data;
    local_3158.ekk_instance_ = (HEkk *)&local_3158.num_col;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3158,"HEkkPrimal::solve","");
    HVar9 = interpretCallStatus(&local_31b8,HVar9,kOk,(string *)&local_3158);
    if (local_3158.ekk_instance_ != (HEkk *)&local_3158.num_col) {
      operator_delete(local_3158.ekk_instance_);
    }
    if (local_31b8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_31b8.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    HEkkPrimal::~HEkkPrimal((HEkkPrimal *)local_2b08);
    goto LAB_00342201;
  }
  std::__cxx11::string::_M_replace((ulong)&local_32d8,0,local_32d0,0x3e307e);
  reportSimplexPhaseIterations
            (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
             true);
  iVar2 = (this->info_).simplex_strategy;
  log_options_ = &(this->options_->super_HighsOptionsStruct).log_options;
  if (iVar2 == 2) {
    format = "Using EKK parallel dual simplex solver - SIP with concurrency of %d\n";
LAB_00341fc5:
    highsLogUser(log_options_,kInfo,format,(ulong)(uint)(this->info_).num_concurrency);
  }
  else {
    if (iVar2 == 3) {
      format = "Using EKK parallel dual simplex solver - PAMI with concurrency of %d\n";
      goto LAB_00341fc5;
    }
    highsLogUser(log_options_,kInfo,"Using EKK dual simplex solver - serial\n");
  }
  HEkkDual::HEkkDual((HEkkDual *)local_2b08,this);
  HVar9 = HEkkDual::solve((HEkkDual *)local_2b08,force_phase2);
  pHVar6 = this->options_;
  local_3218.log_stream = (pHVar6->super_HighsOptionsStruct).log_options.log_stream;
  local_3218.output_flag = (pHVar6->super_HighsOptionsStruct).log_options.output_flag;
  local_3218.log_to_console = (pHVar6->super_HighsOptionsStruct).log_options.log_to_console;
  local_3218.log_dev_level = (pHVar6->super_HighsOptionsStruct).log_options.log_dev_level;
  local_3218.user_log_callback = (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback;
  local_3218.user_log_callback_data =
       (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback_data;
  pfVar1 = &local_3218.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar1,&(pHVar6->super_HighsOptionsStruct).log_options.user_callback);
  local_3218.user_callback_active =
       (pHVar6->super_HighsOptionsStruct).log_options.user_callback_active;
  local_3218.user_callback_data = (pHVar6->super_HighsOptionsStruct).log_options.user_callback_data;
  local_3158.ekk_instance_ = (HEkk *)&local_3158.num_col;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3158,"HEkkDual::solve","");
  HVar9 = interpretCallStatus(&local_3218,HVar9,kOk,(string *)&local_3158);
  if (local_3158.ekk_instance_ != (HEkk *)&local_3158.num_col) {
    operator_delete(local_3158.ekk_instance_);
  }
  if (local_3218.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3218.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if ((this->model_status_ == kUnboundedOrInfeasible) &&
     ((this->options_->super_HighsOptionsStruct).allow_unbounded_or_infeasible == false)) {
    HEkkPrimal::HEkkPrimal(&local_3158,this);
    HVar10 = HEkkPrimal::solve(&local_3158,false);
    pHVar6 = this->options_;
    local_3278.log_stream = (pHVar6->super_HighsOptionsStruct).log_options.log_stream;
    local_3278.output_flag = (pHVar6->super_HighsOptionsStruct).log_options.output_flag;
    local_3278.log_to_console = (pHVar6->super_HighsOptionsStruct).log_options.log_to_console;
    local_3278.log_dev_level = (pHVar6->super_HighsOptionsStruct).log_options.log_dev_level;
    local_3278.user_log_callback = (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback;
    local_3278.user_log_callback_data =
         (pHVar6->super_HighsOptionsStruct).log_options.user_log_callback_data;
    pfVar1 = &local_3278.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,&(pHVar6->super_HighsOptionsStruct).log_options.user_callback);
    local_3278.user_callback_active =
         (pHVar6->super_HighsOptionsStruct).log_options.user_callback_active;
    local_3278.user_callback_data =
         (pHVar6->super_HighsOptionsStruct).log_options.user_callback_data;
    local_32b8._M_dataplus._M_p = (pointer)&local_32b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_32b8,"HEkkPrimal::solve","");
    HVar9 = interpretCallStatus(&local_3278,HVar10,HVar9,&local_32b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_32b8._M_dataplus._M_p != &local_32b8.field_2) {
      operator_delete(local_32b8._M_dataplus._M_p);
    }
    if (local_3278.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3278.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    HEkkPrimal::~HEkkPrimal(&local_3158);
  }
  HEkkDual::~HEkkDual((HEkkDual *)local_2b08);
LAB_00342201:
  reportSimplexPhaseIterations
            (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
             false);
  puVar7 = local_32d8;
  if (HVar9 == kError) {
    HVar9 = kError;
    returnFromEkkSolve(this,kError);
  }
  else {
    pHVar6 = this->options_;
    uVar3 = (this->info_).num_primal_infeasibilities;
    uVar4 = (this->info_).num_dual_infeasibilities;
    utilModelStatusToString_abi_cxx11_((string *)local_2b08,this->model_status_);
    highsLogDev(&(pHVar6->super_HighsOptionsStruct).log_options,kInfo,
                "EKK %s simplex solver returns %d primal and %d dual infeasibilities: Status %s\n",
                puVar7,(ulong)uVar3,(ulong)uVar4,local_2b08._0_8_);
    if ((HEkk *)local_2b08._0_8_ != (HEkk *)(local_2b08 + 0x10)) {
      operator_delete((void *)local_2b08._0_8_);
    }
    if ((this->analysis_).analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::summaryReport(this_00);
    }
    if ((this->analysis_).analyse_factor_data == true) {
      HighsSimplexAnalysis::reportInvertFormData(this_00);
    }
    if ((this->analysis_).analyse_factor_time == true) {
      HighsSimplexAnalysis::reportFactorTimer(this_00);
    }
    returnFromEkkSolve(this,HVar9);
  }
  if (local_32d8 == local_32c8) {
    return HVar9;
  }
  operator_delete(local_32d8);
  return HVar9;
}

Assistant:

HighsStatus HEkk::solve(const bool force_phase2) {
  debugInitialise();

  initialiseAnalysis();
  initialiseControl();

  if (analysis_.analyse_simplex_time)
    analysis_.simplexTimerStart(SimplexTotalClock);
  dual_simplex_cleanup_level_ = 0;
  dual_simplex_phase1_cleanup_level_ = 0;

  previous_iteration_cycling_detected = -kHighsIInf;

  initialiseForSolve();

  const HighsDebugStatus simplex_nla_status =
      simplex_nla_.debugCheckData("Before HEkk::solve()");
  const bool simplex_nla_ok = simplex_nla_status == HighsDebugStatus::kOk;
  if (!simplex_nla_ok) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "Error in simplex NLA data\n");
    assert(simplex_nla_ok);
    return returnFromEkkSolve(HighsStatus::kError);
  }

  const bool report_initial_basis = false;
  if (report_initial_basis) debugReportInitialBasis();

  assert(status_.has_basis);
  assert(status_.has_invert);
  assert(status_.initialised_for_solve);
  if (model_status_ == HighsModelStatus::kOptimal)
    return returnFromEkkSolve(HighsStatus::kOk);

  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  std::string algorithm_name;

  // Indicate that dual and primal rays are not known
  this->clearRayRecords();

  // Allow primal and dual perturbations in case a block on them is
  // hanging over from a previous call
  info_.allow_cost_shifting = true;
  info_.allow_cost_perturbation = true;
  info_.allow_bound_perturbation = true;

  chooseSimplexStrategyThreads(*options_, info_);
  HighsInt& simplex_strategy = info_.simplex_strategy;

  // Initial solve according to strategy
  if (simplex_strategy == kSimplexStrategyPrimal) {
    algorithm_name = "primal";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    highsLogUser(options_->log_options, HighsLogType::kInfo,
                 "Using EKK primal simplex solver\n");
    HEkkPrimal primal_solver(*this);
    call_status = primal_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkPrimal::solve");
  } else {
    algorithm_name = "dual";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    // Solve, depending on the particular strategy
    if (simplex_strategy == kSimplexStrategyDualTasks) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - SIP with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else if (simplex_strategy == kSimplexStrategyDualMulti) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - PAMI with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK dual simplex solver - serial\n");
    }
    HEkkDual dual_solver(*this);
    call_status = dual_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkDual::solve");

    // Dual simplex solver may set model_status to be
    // kUnboundedOrInfeasible, and Highs::run() may not allow that to
    // be returned, so use primal simplex to distinguish
    if (model_status_ == HighsModelStatus::kUnboundedOrInfeasible &&
        !options_->allow_unbounded_or_infeasible) {
      HEkkPrimal primal_solver(*this);
      call_status = primal_solver.solve();
      assert(called_return_from_solve_);
      return_status = interpretCallStatus(options_->log_options, call_status,
                                          return_status, "HEkkPrimal::solve");
    }
  }

  reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_);
  if (return_status == HighsStatus::kError)
    return returnFromEkkSolve(return_status);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "EKK %s simplex solver returns %" HIGHSINT_FORMAT
              " primal and %" HIGHSINT_FORMAT
              " dual infeasibilities: "
              "Status %s\n",
              algorithm_name.c_str(), info_.num_primal_infeasibilities,
              info_.num_dual_infeasibilities,
              utilModelStatusToString(model_status_).c_str());
  // Can model_status_ = HighsModelStatus::kNotset be returned?
  assert(model_status_ != HighsModelStatus::kNotset);

  if (analysis_.analyse_simplex_summary_data) analysis_.summaryReport();
  if (analysis_.analyse_factor_data) analysis_.reportInvertFormData();
  if (analysis_.analyse_factor_time) analysis_.reportFactorTimer();
  return returnFromEkkSolve(return_status);
}